

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O2

MppStopwatch mpp_stopwatch_get(char *name)

{
  undefined8 *ptr;
  void *ptr_00;
  
  ptr = (undefined8 *)mpp_osal_calloc("mpp_stopwatch_get",0x68);
  ptr_00 = mpp_osal_calloc("mpp_stopwatch_get",0x240);
  if (ptr_00 == (void *)0x0 || ptr == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpp_time","malloc failed\n","mpp_stopwatch_get");
    if (ptr != (undefined8 *)0x0) {
      mpp_osal_free("mpp_stopwatch_get",ptr);
    }
    if (ptr_00 != (void *)0x0) {
      mpp_osal_free("mpp_stopwatch_get",ptr_00);
    }
    ptr = (undefined8 *)0x0;
  }
  else {
    *ptr = "mpp_stopwatch";
    snprintf((char *)(ptr + 1),0x3f,name,0);
    ptr[0xc] = ptr_00;
    *(undefined4 *)(ptr + 9) = 8;
  }
  return ptr;
}

Assistant:

MppStopwatch mpp_stopwatch_get(const char *name)
{
    MppStopwatchImpl *impl = mpp_calloc(MppStopwatchImpl, 1);
    MppStopwatchNode *nodes = mpp_calloc(MppStopwatchNode, 8);

    if (impl && nodes) {
        impl->check = stopwatch_name;
        snprintf(impl->name, sizeof(impl->name) - 1, name, NULL);
        impl->nodes = nodes;
        impl->max_count = 8;
    } else {
        mpp_err_f("malloc failed\n");
        MPP_FREE(impl);
        MPP_FREE(nodes);
    }

    return impl;
}